

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

void __thiscall CVmTimeZoneCache::CVmTimeZoneCache(CVmTimeZoneCache *this)

{
  CVmHashTable *pCVar1;
  undefined8 *puVar2;
  
  pCVar1 = (CVmHashTable *)operator_new(0x20);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__CVmHashFunc_0036d878;
  CVmHashTable::init(pCVar1,(EVP_PKEY_CTX *)0x40);
  this->db_tab_ = pCVar1;
  pCVar1 = (CVmHashTable *)operator_new(0x20);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__CVmHashFunc_0036d878;
  CVmHashTable::init(pCVar1,(EVP_PKEY_CTX *)0x40);
  this->synth_tab_ = pCVar1;
  this->index_loaded_ = 0;
  this->index_loaded_ok_ = 0;
  this->local_zone_name_ = (char *)0x0;
  this->local_zone_ = (CVmTimeZone *)0x0;
  this->abbr_tab_ = (CVmHashTable *)0x0;
  this->first_loaded_ = (ZoneHashEntry *)0x0;
  this->zone_bytes_ = (char *)0x0;
  this->link_bytes_ = (char *)0x0;
  this->abbr_bytes_ = (char *)0x0;
  return;
}

Assistant:

CVmTimeZoneCache::CVmTimeZoneCache()
{
    /* create the zone tables */
    db_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);
    synth_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);

    /* we haven't loaded our zone database yet */
    index_loaded_ = index_loaded_ok_ = FALSE;
    zone_bytes_ = 0;
    link_bytes_ = 0;
    abbr_tab_ = 0;
    abbr_bytes_ = 0;
    first_loaded_ = 0;

    /* no local time zone established yet */
    local_zone_ = 0;
    local_zone_name_ = 0;
}